

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert.c
# Opt level: O3

void bgr_555_to_abgr_f32(void *src,int src_pitch,void *dst,int dst_pitch,int sx,int sy,int dx,int dy
                        ,int width,int height)

{
  ALLEGRO_COLOR *pAVar1;
  ushort uVar2;
  int iVar3;
  ALLEGRO_COLOR *pAVar4;
  int iVar5;
  ushort *puVar6;
  ALLEGRO_COLOR AVar7;
  
  if (0 < height) {
    pAVar4 = (ALLEGRO_COLOR *)((long)dst + (long)(dy * dst_pitch) + (long)dx * 0x10);
    puVar6 = (ushort *)((long)src + (long)sx * 2 + (long)(sy * src_pitch));
    iVar3 = dst_pitch + 0xf;
    if (-1 < dst_pitch) {
      iVar3 = dst_pitch;
    }
    iVar5 = 0;
    do {
      if (0 < width) {
        pAVar1 = pAVar4 + width;
        do {
          uVar2 = *puVar6;
          AVar7 = al_map_rgb((uchar)_al_rgb_scale_5[uVar2 & 0x1f],
                             *(uchar *)((long)_al_rgb_scale_5 + (ulong)(uVar2 >> 3 & 0x7c)),
                             *(uchar *)((long)_al_rgb_scale_5 + (ulong)(uVar2 >> 8 & 0x7c)));
          *pAVar4 = AVar7;
          pAVar4 = pAVar4 + 1;
          puVar6 = puVar6 + 1;
        } while (pAVar4 < pAVar1);
      }
      pAVar4 = pAVar4 + ((iVar3 >> 4) - width);
      puVar6 = puVar6 + (src_pitch / 2 - width);
      iVar5 = iVar5 + 1;
    } while (iVar5 != height);
  }
  return;
}

Assistant:

static void bgr_555_to_abgr_f32(const void *src, int src_pitch,
   void *dst, int dst_pitch,
   int sx, int sy, int dx, int dy, int width, int height)
{
   int y;
   const uint16_t *src_ptr = (const uint16_t *)((const char *)src + sy * src_pitch);
   ALLEGRO_COLOR *dst_ptr = (void *)((char *)dst + dy * dst_pitch);
   int src_gap = src_pitch / 2 - width;
   int dst_gap = dst_pitch / 16 - width;
   src_ptr += sx;
   dst_ptr += dx;
   for (y = 0; y < height; y++) {
      ALLEGRO_COLOR *dst_end = dst_ptr + width;
      while (dst_ptr < dst_end) {
         *dst_ptr = ALLEGRO_CONVERT_BGR_555_TO_ABGR_F32(*src_ptr);
         dst_ptr++;
         src_ptr++;
      }
      src_ptr += src_gap;
      dst_ptr += dst_gap;
   }
}